

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FCS.cpp
# Opt level: O0

uint32_t FCS::ChecksumAdd(uint8_t *buffer,int length,uint32_t checksum)

{
  int local_20;
  int32_t i;
  uint16_t value;
  uint32_t checksum_local;
  int length_local;
  uint8_t *buffer_local;
  
  i = checksum;
  for (local_20 = 0; local_20 < length / 2; local_20 = local_20 + 1) {
    i = (uint)CONCAT11(buffer[local_20 << 1],buffer[local_20 * 2 + 1]) + i;
  }
  return i;
}

Assistant:

uint32_t FCS::ChecksumAdd(const uint8_t* buffer, int length, uint32_t checksum)
{
    uint16_t value;
    int32_t i;

    // Don't need to add in the checksum field so only 9x16 bit words in header
    for (i = 0; i < length / 2; i++)
    {
        value = (buffer[i * 2] << 8) | buffer[i * 2 + 1];
        checksum += (uint32_t)value;
    }

    return checksum;
}